

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

string * __thiscall
ImgfsFile::nameinfo::name_abi_cxx11_(string *__return_storage_ptr__,nameinfo *this,ImgfsFile *imgfs)

{
  string *this_00;
  Wstring wstr;
  ByteVector entdata;
  undefined1 local_b0 [32];
  string local_90 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  this_00 = &this->_name;
  if ((this->_name)._M_string_length == 0) {
    if ((this->_flags & 2) == 0) {
      std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)local_b0,
                 &(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
      (**(code **)(*(long *)local_b0._0_8_ + 0x20))(local_b0._0_8_,this->_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      local_b0._0_8_ = local_b0 + 0x10;
      local_b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0._16_2_ = 0;
      std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)
      ;
      readutf16le<std::shared_ptr<ReadWriter>>
                ((shared_ptr<ReadWriter> *)&local_58,(Wstring *)local_b0,(ulong)this->_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      ToString<unsigned_short>
                (&local_48,
                 (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)local_b0);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)local_b0);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
                 (ulong)(imgfs->_hdr).direntsize,(allocator_type *)local_b0);
      std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)local_b0,
                 &(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
      (**(code **)(*(long *)local_b0._0_8_ + 0x20))(local_b0._0_8_,this->_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)local_b0,
                 &(imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
      (**(code **)(*(long *)local_b0._0_8_ + 0x10))
                (local_b0._0_8_,local_70._M_impl.super__Vector_impl_data._M_start,
                 (long)local_70._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70._M_impl.super__Vector_impl_data._M_start);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      NameEntry::NameEntry
                ((NameEntry *)local_b0,(ulong)this->_ptr,
                 local_70._M_impl.super__Vector_impl_data._M_start,(ulong)this->_length);
      std::__cxx11::string::string((string *)&local_48,local_90);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      NameEntry::~NameEntry((NameEntry *)local_b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string name(ImgfsFile& imgfs)
        {
            if (_name.empty()) {
                if (_flags&2) {
                    ByteVector entdata(imgfs.direntsize());
                    imgfs.rd()->setpos(_ptr);
                    imgfs.rd()->read(&entdata[0], entdata.size());
                    NameEntry ent(_ptr, &entdata[0], _length);
                    _name= ent.name();
                }
                else {
                    imgfs.rd()->setpos(_ptr);

                    std::Wstring wstr;
                    readutf16le(imgfs.rd(), wstr, _length);

                    _name= ToString(wstr);
                }
            }
            return _name;
        }